

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O0

QVariant * __thiscall
QMimeDataPrivate::retrieveTypedData(QMimeDataPrivate *this,QString *format,QMetaType type)

{
  QByteArrayView data_00;
  QMetaType targetType;
  QByteArrayView text_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  FormattingOptions options;
  QString *format_00;
  QMetaType in_RCX;
  QMimeDataPrivate *in_RDX;
  QMimeDataPrivate *in_RSI;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  QVariant *element_1;
  QList<QVariant> *__range4_1;
  QVariant *element;
  QList<QVariant> *__range4;
  int numUrls;
  int typeId;
  QMimeData *q;
  QVariant *newData;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  QList<QVariant> list_1;
  QByteArray result;
  QByteArrayView bav;
  QByteArray ba;
  const_iterator __end4;
  const_iterator __begin4;
  QList<QVariant> list;
  QString text;
  QStringDecoder decoder;
  QVariant data;
  undefined4 in_stack_fffffffffffffa88;
  int in_stack_fffffffffffffa8c;
  undefined4 in_stack_fffffffffffffa90;
  int in_stack_fffffffffffffa94;
  QVariant *in_stack_fffffffffffffa98;
  char c;
  EncodedData<const_QByteArray_&> *in_stack_fffffffffffffaa0;
  undefined7 in_stack_fffffffffffffaa8;
  undefined1 in_stack_fffffffffffffaaf;
  undefined4 in_stack_fffffffffffffab8;
  FormattingOptions in_stack_fffffffffffffabc;
  QUrl *in_stack_fffffffffffffad0;
  QVariant *in_stack_fffffffffffffaf0;
  undefined2 in_stack_fffffffffffffb18;
  undefined1 in_stack_fffffffffffffb1a;
  undefined1 uVar4;
  int in_stack_fffffffffffffb1c;
  QMetaType in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb28;
  int in_stack_fffffffffffffb2c;
  byte local_4b2;
  undefined4 in_stack_fffffffffffffb80;
  int in_stack_fffffffffffffb84;
  QMetaType in_stack_fffffffffffffb88;
  byte local_421;
  int local_40c;
  int local_3f8;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_3bc [9];
  QMetaTypeInterface *local_398;
  QVariant *local_390;
  const_iterator local_388;
  const_iterator local_380;
  undefined1 *local_378;
  undefined1 *puStack_370;
  undefined1 *local_368;
  undefined1 *local_358;
  undefined1 *puStack_350;
  undefined1 *local_348;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_33c [27];
  QMetaTypeInterface *local_2d0;
  QByteArrayView local_2c8;
  QByteArrayView local_298;
  QLatin1StringView local_280;
  EncodedData<const_QByteArray_&> local_250;
  QLatin1StringView local_218;
  QByteArray local_208;
  QMetaTypeInterface *local_1f0;
  QMetaTypeInterface *local_1e8;
  QMetaTypeInterface *local_1e0;
  QMetaTypeInterface *local_1d8;
  QMetaTypeInterface *local_1d0;
  QMetaTypeInterface *local_1c8;
  QChar local_1be;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_1bc [9];
  QMetaTypeInterface *local_198;
  QVariant *local_190;
  const_iterator local_188;
  const_iterator local_180;
  undefined1 *local_178;
  undefined1 *puStack_170;
  undefined1 *local_168;
  undefined1 *local_158;
  undefined1 *puStack_150;
  undefined1 *local_148;
  QMetaTypeInterface *local_140;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_134 [9];
  QMetaTypeInterface *local_110;
  QLatin1StringView local_e8;
  undefined1 local_c8 [16];
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  anon_union_16_2_cfafc8b3_for_State_4 local_a8;
  ClearDataFn local_98;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  format_00 = (QString *)q_func(in_RSI);
  iVar2 = QMetaType::id((QMetaType *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                        in_stack_fffffffffffffa8c);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  (**(_func_int **)&(format_00->d).d[7].super_QArrayData)(&local_28,format_00,in_RDX,in_RCX.d_ptr);
  local_e8 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)in_stack_fffffffffffffa98,
                        CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
  bVar1 = ::operator==((QString *)in_stack_fffffffffffffa98,
                       (QLatin1StringView *)
                       CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
  local_421 = 0;
  if (bVar1) {
    bVar1 = ::QVariant::isValid((QVariant *)
                                CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
    local_421 = bVar1 ^ 0xff;
  }
  if ((local_421 & 1) != 0) {
    textUriListLiteral();
    QMetaType::QMetaType
              ((QMetaType *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
               in_stack_fffffffffffffa8c);
    retrieveTypedData(in_RDX,format_00,in_RCX);
    ::QVariant::operator=
              (in_stack_fffffffffffffa98,
               (QVariant *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
    ::QVariant::~QVariant((QVariant *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90))
    ;
    QString::~QString((QString *)0x3e3f4b);
    local_110 = (QMetaTypeInterface *)
                ::QVariant::metaType
                          ((QVariant *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88)
                          );
    iVar3 = QMetaType::id((QMetaType *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90)
                          ,in_stack_fffffffffffffa8c);
    if (iVar3 == 0x11) {
      ::QVariant::toUrl((QVariant *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
                (local_134,PrettyDecoded);
      QUrl::toDisplayString
                ((QUrl *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
                 in_stack_fffffffffffffabc);
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                 (QString *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      ::QVariant::operator=
                (in_stack_fffffffffffffa98,
                 (QVariant *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
      ::QVariant::~QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
      QString::~QString((QString *)0x3e4024);
      QUrl::~QUrl((QUrl *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
    }
    else {
      in_stack_fffffffffffffb88 =
           ::QVariant::metaType
                     ((QVariant *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      local_140 = in_stack_fffffffffffffb88.d_ptr;
      in_stack_fffffffffffffb84 =
           QMetaType::id((QMetaType *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                         in_stack_fffffffffffffa8c);
      if (in_stack_fffffffffffffb84 == 9) {
        local_158 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_150 = &DAT_aaaaaaaaaaaaaaaa;
        local_148 = &DAT_aaaaaaaaaaaaaaaa;
        QString::QString((QString *)0x3e412c);
        local_3f8 = 0;
        local_168 = &DAT_aaaaaaaaaaaaaaaa;
        local_178 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_170 = &DAT_aaaaaaaaaaaaaaaa;
        ::QVariant::toList((QVariant *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88)
                          );
        local_180.i = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
        local_180 = QList<QVariant>::begin
                              ((QList<QVariant> *)
                               CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
        local_188.i = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
        local_188 = QList<QVariant>::end
                              ((QList<QVariant> *)
                               CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
        while( true ) {
          local_190 = local_188.i;
          bVar1 = QList<QVariant>::const_iterator::operator!=(&local_180,local_188);
          if (!bVar1) break;
          QList<QVariant>::const_iterator::operator*(&local_180);
          local_198 = (QMetaTypeInterface *)
                      ::QVariant::metaType
                                ((QVariant *)
                                 CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
          iVar3 = QMetaType::id((QMetaType *)
                                CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                                in_stack_fffffffffffffa8c);
          if (iVar3 == 0x11) {
            ::QVariant::toUrl((QVariant *)
                              CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
            QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
                      (local_1bc,PrettyDecoded);
            QUrl::toDisplayString
                      ((QUrl *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
                       in_stack_fffffffffffffabc);
            QString::operator+=((QString *)
                                CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                                (QString *)
                                CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
            QString::~QString((QString *)0x3e4307);
            QUrl::~QUrl((QUrl *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
            QChar::QChar<char16_t,_true>(&local_1be,L'\n');
            QString::operator+=((QString *)
                                CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                                (QChar)(char16_t)((ulong)in_stack_fffffffffffffa98 >> 0x30));
            local_3f8 = local_3f8 + 1;
          }
          QList<QVariant>::const_iterator::operator++(&local_180);
        }
        if (local_3f8 == 1) {
          QString::chop((QString *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                        CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
        }
        ::QVariant::QVariant
                  ((QVariant *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                   (QString *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
        ::QVariant::operator=
                  (in_stack_fffffffffffffa98,
                   (QVariant *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
        ::QVariant::~QVariant
                  ((QVariant *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
        QList<QVariant>::~QList((QList<QVariant> *)0x3e4458);
        QString::~QString((QString *)0x3e4465);
      }
    }
  }
  local_1c8 = (QMetaTypeInterface *)
              ::QVariant::metaType
                        ((QVariant *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
  bVar1 = ::operator==((QMetaType *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                       (QMetaType *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
  local_4b2 = 1;
  if (!bVar1) {
    bVar1 = ::QVariant::isValid((QVariant *)
                                CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
    local_4b2 = bVar1 ^ 0xff;
  }
  if ((local_4b2 & 1) != 0) {
    ::QVariant::QVariant
              ((QVariant *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
               (QVariant *)0x3e452e);
    goto LAB_003e51a8;
  }
  if (iVar2 == 0x11) {
    local_1d0 = (QMetaTypeInterface *)
                ::QVariant::metaType
                          ((QVariant *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88)
                          );
    iVar3 = QMetaType::id((QMetaType *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90)
                          ,in_stack_fffffffffffffa8c);
    bVar1 = true;
    if (iVar3 != 9) goto LAB_003e459c;
  }
  else {
LAB_003e459c:
    bVar1 = false;
    if (iVar2 == 9) {
      local_1d8 = (QMetaTypeInterface *)
                  ::QVariant::metaType
                            ((QVariant *)
                             CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      in_stack_fffffffffffffb2c =
           QMetaType::id((QMetaType *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                         in_stack_fffffffffffffa8c);
      bVar1 = in_stack_fffffffffffffb2c == 0x11;
    }
  }
  if (bVar1) {
    ::QVariant::QVariant
              ((QVariant *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
               (QVariant *)0x3e4632);
    goto LAB_003e51a8;
  }
  if (iVar2 == 0x1001) {
    in_stack_fffffffffffffb20 =
         ::QVariant::metaType
                   ((QVariant *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    local_1e0 = in_stack_fffffffffffffb20.d_ptr;
    in_stack_fffffffffffffb1c =
         QMetaType::id((QMetaType *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                       in_stack_fffffffffffffa8c);
    uVar4 = true;
    if (in_stack_fffffffffffffb1c != 0x1006) goto LAB_003e46a6;
  }
  else {
LAB_003e46a6:
    in_stack_fffffffffffffb1a = false;
    uVar4 = in_stack_fffffffffffffb1a;
    if (iVar2 == 0x1006) {
      local_1e8 = (QMetaTypeInterface *)
                  ::QVariant::metaType
                            ((QVariant *)
                             CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      iVar3 = QMetaType::id((QMetaType *)
                            CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                            in_stack_fffffffffffffa8c);
      in_stack_fffffffffffffb1a = iVar3 == 0x1001;
      uVar4 = in_stack_fffffffffffffb1a;
    }
  }
  if ((bool)uVar4 != false) {
    ::QVariant::QVariant
              ((QVariant *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
               (QVariant *)0x3e4741);
    goto LAB_003e51a8;
  }
  local_1f0 = (QMetaTypeInterface *)
              ::QVariant::metaType
                        ((QVariant *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
  options.i = QMetaType::id((QMetaType *)
                            CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                            in_stack_fffffffffffffa8c);
  if (options.i == 0xc) {
    if (iVar2 == 9) {
      local_280 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_fffffffffffffa98,
                             CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
      bVar1 = ::operator!=((QString *)in_stack_fffffffffffffa98,
                           (QLatin1StringView *)
                           CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
      if (!bVar1) {
LAB_003e4b5f:
        c = (char)((ulong)in_stack_fffffffffffffa98 >> 0x38);
        local_298.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_298.m_data = &DAT_aaaaaaaaaaaaaaaa;
        local_298 = ::QVariant::view<QByteArrayView>
                              ((QVariant *)
                               CONCAT44(in_stack_fffffffffffffabc.i,in_stack_fffffffffffffab8));
        bVar1 = QByteArrayView::endsWith((QByteArrayView *)in_stack_fffffffffffffaa0,c);
        if (bVar1) {
          QByteArrayView::chop(&local_298,1);
        }
        text_00.m_size._4_4_ = in_stack_fffffffffffffb84;
        text_00.m_size._0_4_ = in_stack_fffffffffffffb80;
        text_00.m_data = (storage_type *)in_stack_fffffffffffffb88.d_ptr;
        local_2c8 = local_298;
        dataToUrls(text_00);
        ::QVariant::QVariant
                  ((QVariant *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                   (QList<QVariant> *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88))
        ;
        QList<QVariant>::~QList((QList<QVariant> *)0x3e4c1d);
        goto LAB_003e51a8;
      }
    }
    else {
      if (iVar2 == 10) {
        local_208.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_208.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        local_208.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        ::QVariant::toByteArray
                  ((QVariant *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
        bVar1 = QByteArray::isNull((QByteArray *)0x3e481d);
        if (bVar1) {
          ::QVariant::QVariant((QVariant *)0x3e4830);
        }
        else {
          local_218 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)in_stack_fffffffffffffa98,
                                 CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
          bVar1 = ::operator==((QString *)in_stack_fffffffffffffa98,
                               (QLatin1StringView *)
                               CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
          if (bVar1) {
            local_98 = (ClearDataFn)&DAT_aaaaaaaaaaaaaaaa;
            local_a8.d[0] = &DAT_aaaaaaaaaaaaaaaa;
            local_a8.d[1] = &DAT_aaaaaaaaaaaaaaaa;
            local_b8 = &DAT_aaaaaaaaaaaaaaaa;
            puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
            local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QByteArrayView::QByteArrayView<QByteArray,_true>
                      ((QByteArrayView *)in_stack_fffffffffffffaa0,
                       (QByteArray *)in_stack_fffffffffffffa98);
            data_00.m_size._2_1_ = in_stack_fffffffffffffb1a;
            data_00.m_size._0_2_ = in_stack_fffffffffffffb18;
            data_00.m_size._3_1_ = uVar4;
            data_00.m_size._4_4_ = in_stack_fffffffffffffb1c;
            data_00.m_data = (storage_type *)in_stack_fffffffffffffb20.d_ptr;
            QStringDecoder::decoderForHtml(data_00);
            bVar1 = QStringConverter::isValid((QStringConverter *)local_c8);
            if (bVar1) {
              local_250 = QStringDecoder::operator()((QStringDecoder *)local_c8,&local_208);
              QStringDecoder::EncodedData::operator_cast_to_QString(in_stack_fffffffffffffaa0);
              ::QVariant::QVariant
                        ((QVariant *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                         (QString *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
              QString::~QString((QString *)0x3e4978);
            }
            QStringDecoder::~QStringDecoder((QStringDecoder *)0x3e49e1);
            if (bVar1) goto LAB_003e4a34;
          }
          QString::fromUtf8<void>
                    ((QByteArray *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
          ::QVariant::QVariant
                    ((QVariant *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                     (QString *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
          QString::~QString((QString *)0x3e4a29);
        }
LAB_003e4a34:
        QByteArray::~QByteArray((QByteArray *)0x3e4a41);
        goto LAB_003e51a8;
      }
      if (iVar2 == 0x11) goto LAB_003e4b5f;
      if (iVar2 == 0x1003) {
        *(undefined1 **)((long)&(in_RDI->d).data + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
        *(undefined1 **)&(in_RDI->d).field_0x18 = &DAT_aaaaaaaaaaaaaaaa;
        (in_RDI->d).data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        *(undefined1 **)((long)&(in_RDI->d).data + 8) = &DAT_aaaaaaaaaaaaaaaa;
        ::QVariant::QVariant
                  ((QVariant *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                   (QVariant *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
        QMetaType::QMetaType
                  ((QMetaType *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                   in_stack_fffffffffffffa8c);
        targetType.d_ptr._4_4_ = in_stack_fffffffffffffb2c;
        targetType.d_ptr._0_4_ = in_stack_fffffffffffffb28;
        ::QVariant::convert(in_stack_fffffffffffffaf0,targetType);
        goto LAB_003e51a8;
      }
    }
  }
  else if (iVar2 == 0xc) {
    local_2d0 = (QMetaTypeInterface *)
                ::QVariant::metaType
                          ((QVariant *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88)
                          );
    iVar2 = QMetaType::id((QMetaType *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90)
                          ,in_stack_fffffffffffffa8c);
    if (iVar2 != 9) {
      if (iVar2 == 10) {
        ::QVariant::toString
                  ((QVariant *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
        QString::toUtf8((QString *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
        ::QVariant::QVariant
                  ((QVariant *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                   (QByteArray *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
        QByteArray::~QByteArray((QByteArray *)0x3e4d56);
        QString::~QString((QString *)0x3e4d63);
        goto LAB_003e51a8;
      }
      if (iVar2 != 0xc) {
        if (iVar2 == 0x11) {
          ::QVariant::toUrl((QVariant *)
                            CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
          QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
                    (local_33c,FullyEncoded);
          QUrl::toEncoded(in_stack_fffffffffffffad0,options);
          ::QVariant::QVariant
                    ((QVariant *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                     (QByteArray *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
          QByteArray::~QByteArray((QByteArray *)0x3e4e08);
          QUrl::~QUrl((QUrl *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
          goto LAB_003e51a8;
        }
        if (iVar2 != 0x1003) goto LAB_003e5188;
      }
      ::QVariant::toByteArray
                ((QVariant *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                 (QByteArray *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      QByteArray::~QByteArray((QByteArray *)0x3e4cf6);
      goto LAB_003e51a8;
    }
    local_358 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_350 = &DAT_aaaaaaaaaaaaaaaa;
    local_348 = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray((QByteArray *)0x3e4e82);
    local_368 = &DAT_aaaaaaaaaaaaaaaa;
    local_378 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_370 = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::toList((QVariant *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    local_380.i = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
    local_380 = QList<QVariant>::begin
                          ((QList<QVariant> *)
                           CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
    local_388.i = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
    local_388 = QList<QVariant>::end
                          ((QList<QVariant> *)
                           CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
    while( true ) {
      local_390 = local_388.i;
      bVar1 = QList<QVariant>::const_iterator::operator!=(&local_380,local_388);
      if (!bVar1) break;
      QList<QVariant>::const_iterator::operator*(&local_380);
      local_398 = (QMetaTypeInterface *)
                  ::QVariant::metaType
                            ((QVariant *)
                             CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      in_stack_fffffffffffffa94 =
           QMetaType::id((QMetaType *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                         in_stack_fffffffffffffa8c);
      if (in_stack_fffffffffffffa94 == 0x11) {
        ::QVariant::toUrl((QVariant *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88))
        ;
        QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
                  (local_3bc,FullyEncoded);
        QUrl::toEncoded(in_stack_fffffffffffffad0,options);
        QByteArray::operator+=
                  ((QByteArray *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                   (QByteArray *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
        QByteArray::~QByteArray((QByteArray *)0x3e503a);
        QUrl::~QUrl((QUrl *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
        QByteArray::operator+=
                  ((QByteArray *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                   (char *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      }
      QList<QVariant>::const_iterator::operator++(&local_380);
    }
    bVar1 = QByteArray::isEmpty((QByteArray *)0x3e510d);
    if (bVar1) {
      local_40c = 5;
    }
    else {
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                 (QByteArray *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      local_40c = 1;
    }
    QList<QVariant>::~QList((QList<QVariant> *)0x3e514b);
    QByteArray::~QByteArray((QByteArray *)0x3e5158);
    if (local_40c != 5) goto LAB_003e51a8;
  }
LAB_003e5188:
  ::QVariant::QVariant
            ((QVariant *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
             (QVariant *)0x3e519d);
LAB_003e51a8:
  ::QVariant::~QVariant((QVariant *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QMimeDataPrivate::retrieveTypedData(const QString &format, QMetaType type) const
{
    Q_Q(const QMimeData);
    int typeId = type.id();

    QVariant data = q->retrieveData(format, type);

    // Text data requested: fallback to URL data if available
    if (format == "text/plain"_L1 && !data.isValid()) {
        data = retrieveTypedData(textUriListLiteral(), QMetaType(QMetaType::QVariantList));
        if (data.metaType().id() == QMetaType::QUrl) {
            data = QVariant(data.toUrl().toDisplayString());
        } else if (data.metaType().id() == QMetaType::QVariantList) {
            QString text;
            int numUrls = 0;
            const QList<QVariant> list = data.toList();
            for (const auto &element : list) {
                if (element.metaType().id() == QMetaType::QUrl) {
                    text += element.toUrl().toDisplayString();
                    text += u'\n';
                    ++numUrls;
                }
            }
            if (numUrls == 1)
                text.chop(1); // no final '\n' if there's only one URL
            data = QVariant(text);
        }
    }

    if (data.metaType() == type || !data.isValid())
        return data;

    // provide more conversion possibilities than just what QVariant provides

    // URLs can be lists as well...
    if ((typeId == QMetaType::QUrl && data.metaType().id() == QMetaType::QVariantList)
        || (typeId == QMetaType::QVariantList && data.metaType().id() == QMetaType::QUrl))
        return data;

    // images and pixmaps are interchangeable
    if ((typeId == QMetaType::QPixmap && data.metaType().id() == QMetaType::QImage)
        || (typeId == QMetaType::QImage && data.metaType().id() == QMetaType::QPixmap))
        return data;

    if (data.metaType().id() == QMetaType::QByteArray) {
        // see if we can convert to the requested type
        switch (typeId) {
        case QMetaType::QString: {
            const QByteArray ba = data.toByteArray();
            if (ba.isNull())
                return QVariant();
            if (format == "text/html"_L1) {
                QStringDecoder decoder = QStringDecoder::decoderForHtml(ba);
                if (decoder.isValid()) {
                    return QString(decoder(ba));
                }
                // fall back to utf8
            }
            return QString::fromUtf8(ba);
        }
        case QMetaType::QColor: {
            QVariant newData = data;
            newData.convert(QMetaType(QMetaType::QColor));
            return newData;
        }
        case QMetaType::QVariantList: {
            if (format != "text/uri-list"_L1)
                break;
            Q_FALLTHROUGH();
        }
        case QMetaType::QUrl: {
            auto bav = data.view<QByteArrayView>();
            // Qt 3.x will send text/uri-list with a trailing
            // null-terminator (that is *not* sent for any other
            // text/* mime-type), so chop it off
            if (bav.endsWith('\0'))
                bav.chop(1);
            return dataToUrls(bav);
        }
        default:
            break;
        }

    } else if (typeId == QMetaType::QByteArray) {

        // try to convert to bytearray
        switch (data.metaType().id()) {
        case QMetaType::QByteArray:
        case QMetaType::QColor:
            return data.toByteArray();
        case QMetaType::QString:
            return data.toString().toUtf8();
        case QMetaType::QUrl:
            return data.toUrl().toEncoded();
        case QMetaType::QVariantList: {
            // has to be list of URLs
            QByteArray result;
            const QList<QVariant> list = data.toList();
            for (const auto &element : list) {
                if (element.metaType().id() == QMetaType::QUrl) {
                    result += element.toUrl().toEncoded();
                    result += "\r\n";
                }
            }
            if (!result.isEmpty())
                return result;
            break;
        }
        default:
            break;
        }
    }
    return data;
}